

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

DWORD GetFileType(HANDLE hFile)

{
  DWORD local_24;
  CPalThread *pCStack_20;
  DWORD dwFileType;
  CPalThread *pThread;
  HANDLE pVStack_10;
  PAL_ERROR palError;
  HANDLE hFile_local;
  
  pThread._4_4_ = 0;
  pVStack_10 = hFile;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pCStack_20 = CorUnix::InternalGetCurrentThread();
  pThread._4_4_ = CorUnix::InternalGetFileType(pCStack_20,pVStack_10,&local_24);
  if (pThread._4_4_ == 0) {
    if (local_24 == 0) {
      CorUnix::CPalThread::SetLastError(0);
    }
  }
  else {
    local_24 = 0;
    CorUnix::CPalThread::SetLastError(pThread._4_4_);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return local_24;
  }
  abort();
}

Assistant:

DWORD
PALAPI
GetFileType(
        IN HANDLE hFile)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread;
    DWORD dwFileType;

    PERF_ENTRY(GetFileType);
    ENTRY("GetFileType(hFile=%p)\n", hFile);

    pThread = InternalGetCurrentThread();

    palError = InternalGetFileType(
        pThread,
        hFile,
        &dwFileType
        );

    if (NO_ERROR != palError)
    {
        dwFileType = FILE_TYPE_UNKNOWN;
        pThread->SetLastError(palError);
    }
    else if (FILE_TYPE_UNKNOWN == dwFileType)
    {
        pThread->SetLastError(palError);
    }


    LOGEXIT("GetFileType returns DWORD %#x\n", dwFileType);
    PERF_EXIT(GetFileType);
    return dwFileType;
}